

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O1

bool __thiscall
Clasp::mt::SharedLitsClause::isReverseReason
          (SharedLitsClause *this,Solver *s,Literal p,uint32 maxL,uint32 maxN)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  SharedLiterals *pSVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  
  pSVar4 = (this->super_ClauseHead).field_0.shared_;
  uVar1 = pSVar4->size_type_;
  bVar7 = uVar1 < 4;
  if (!bVar7) {
    uVar5 = 0;
    uVar6 = 0;
    do {
      uVar2 = *(uint *)((long)&pSVar4[1].refCount_.super___atomic_base<int>._M_i + uVar5);
      if (1 < (uVar2 ^ p.rep_)) {
        uVar3 = *(uint *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar2 & 0xfffffffc));
        if ((byte)((byte)uVar3 & 3) != (byte)(((uVar2 & 2) == 0) + 1U)) {
          return bVar7;
        }
        if ((uVar3 & (uVar2 & 2) * 2 + 4) == 0 && maxL <= uVar3 >> 4) {
          return bVar7;
        }
        if (((uVar3 & 0xc) == 0) && (uVar6 = uVar6 + 1, maxN < uVar6)) {
          return bVar7;
        }
      }
      uVar5 = uVar5 + 4;
      bVar7 = (uVar1 & 0xfffffffc) == uVar5;
    } while (!bVar7);
  }
  return bVar7;
}

Assistant:

bool SharedLitsClause::isReverseReason(const Solver& s, Literal p, uint32 maxL, uint32 maxN) {
	uint32 notSeen = 0;
	for (const Literal* r = shared_->begin(), *end = shared_->end(); r != end; ++r) {
		if (*r == p) continue;
		if (!isRevLit(s, *r, maxL)) return false;
		if (!s.seen(r->var()) && ++notSeen > maxN) return false;
	}
	return true;
}